

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_event.c
# Opt level: O0

char * ngx_event_use(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  long *plVar2;
  int iVar3;
  ngx_event_module_t *module;
  ngx_event_conf_t *old_ecf;
  ngx_str_t *value;
  ngx_int_t m;
  ngx_event_conf_t *ecf;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  if (*(long *)((long)conf + 8) == -1) {
    pvVar1 = cf->args->elts;
    if (cf->cycle->old_cycle->conf_ctx == (void ****)0x0) {
      module = (ngx_event_module_t *)0x0;
    }
    else {
      module = (ngx_event_module_t *)
               (*cf->cycle->old_cycle->conf_ctx[ngx_events_module.index])
               [ngx_event_core_module.ctx_index];
    }
    for (value = (ngx_str_t *)0x0; cf->cycle->modules[(long)value] != (ngx_module_t *)0x0;
        value = (ngx_str_t *)((long)&value->len + 1)) {
      if (((cf->cycle->modules[(long)value]->type == 0x544e5645) &&
          (plVar2 = (long *)cf->cycle->modules[(long)value]->ctx,
          *(long *)*plVar2 == *(long *)((long)pvVar1 + 0x10))) &&
         (iVar3 = strcmp(*(char **)(*plVar2 + 8),*(char **)((long)pvVar1 + 0x18)), iVar3 == 0)) {
        *(ngx_uint_t *)((long)conf + 8) = cf->cycle->modules[(long)value]->ctx_index;
        *(undefined8 *)((long)conf + 0x28) = *(undefined8 *)(*plVar2 + 8);
        if (((ngx_process == 0) && (module != (ngx_event_module_t *)0x0)) &&
           (module->create_conf != *(_func_void_ptr_ngx_cycle_t_ptr **)((long)conf + 8))) {
          ngx_conf_log_error(1,cf,0,
                             "when the server runs without a master process the \"%V\" event type must be the same as in previous configuration - \"%s\" and it cannot be changed on the fly, to change it you need to stop server and start it again"
                             ,(long)pvVar1 + 0x10,(module->actions).enable);
          return (char *)0xffffffffffffffff;
        }
        return (char *)0x0;
      }
    }
    ngx_conf_log_error(1,cf,0,"invalid event type \"%V\"",(long)pvVar1 + 0x10);
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  else {
    cf_local = (ngx_conf_t *)anon_var_dwarf_1243;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_event_use(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_event_conf_t  *ecf = conf;

    ngx_int_t             m;
    ngx_str_t            *value;
    ngx_event_conf_t     *old_ecf;
    ngx_event_module_t   *module;

    if (ecf->use != NGX_CONF_UNSET_UINT) {
        return "is duplicate";
    }

    value = cf->args->elts;

    if (cf->cycle->old_cycle->conf_ctx) {
        old_ecf = ngx_event_get_conf(cf->cycle->old_cycle->conf_ctx,
                                     ngx_event_core_module);
    } else {
        old_ecf = NULL;
    }


    for (m = 0; cf->cycle->modules[m]; m++) {
        if (cf->cycle->modules[m]->type != NGX_EVENT_MODULE) {
            continue;
        }

        module = cf->cycle->modules[m]->ctx;
        if (module->name->len == value[1].len) {
            if (ngx_strcmp(module->name->data, value[1].data) == 0) {
                ecf->use = cf->cycle->modules[m]->ctx_index;
                ecf->name = module->name->data;

                if (ngx_process == NGX_PROCESS_SINGLE
                    && old_ecf
                    && old_ecf->use != ecf->use)
                {
                    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "when the server runs without a master process "
                               "the \"%V\" event type must be the same as "
                               "in previous configuration - \"%s\" "
                               "and it cannot be changed on the fly, "
                               "to change it you need to stop server "
                               "and start it again",
                               &value[1], old_ecf->name);

                    return NGX_CONF_ERROR;
                }

                return NGX_CONF_OK;
            }
        }
    }

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                       "invalid event type \"%V\"", &value[1]);

    return NGX_CONF_ERROR;
}